

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O2

void __thiscall
duckdb::SelectionVector::Initialize(SelectionVector *this,buffer_ptr<SelectionData> *data)

{
  SelectionData *pSVar1;
  
  shared_ptr<duckdb::SelectionData,_true>::operator=(&this->selection_data,data);
  pSVar1 = shared_ptr<duckdb::SelectionData,_true>::operator->(&this->selection_data);
  this->sel_vector = (sel_t *)(pSVar1->owned_data).pointer;
  return;
}

Assistant:

void Initialize(buffer_ptr<SelectionData> data) {
		selection_data = std::move(data);
		sel_vector = reinterpret_cast<sel_t *>(selection_data->owned_data.get());
	}